

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O1

MPP_RET hal_h264e_vepu580_ret_task(void *hal,HalEncTask *task)

{
  int iVar1;
  int iVar2;
  int iVar3;
  EncRcTask *pEVar4;
  long *plVar5;
  uint uVar6;
  uint uVar7;
  RK_U32 RVar8;
  sbyte sVar9;
  RK_U32 RVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  RK_S32 madp_cnt_statistics [5];
  int local_48 [6];
  
  lVar14 = *(long *)((long)hal + 0x1a0);
  iVar13 = (task->flags).reg_idx;
  uVar18 = *(int *)(*(long *)((long)hal + 0x60) + 0x40) *
           *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
  pEVar4 = task->rc_task;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_ret_task",hal);
  }
  task->length = task->length + task->hw_length;
  iVar12 = task->hw_length << 3;
  (pEVar4->info).bit_real = iVar12;
  lVar14 = (long)iVar13 * 0x1cb8 + lVar14;
  uVar11 = 0;
  uVar6 = *(uint *)(lVar14 + 0x169c) / uVar18;
  (pEVar4->info).quality_real = uVar6;
  uVar7 = 0;
  uVar15 = *(uint *)(lVar14 + 0x17bc) & 0x7fffff;
  if (uVar15 != 0) {
    uVar7 = *(uint *)(lVar14 + 0x17b8) / uVar15;
  }
  (pEVar4->info).madi = uVar7;
  uVar7 = *(uint *)(lVar14 + 0x17b4) & 0x1fffff;
  if (uVar7 != 0) {
    uVar11 = *(uint *)(lVar14 + 0x17b0) / uVar7;
  }
  (pEVar4->info).madp = uVar11;
  uVar7 = (((*(uint *)(lVar14 + 0x17a4) & 0x1fffff) +
           (*(uint *)(lVar14 + 0x17a8) & 0x7fffff) + (*(uint *)(lVar14 + 0x17ac) & 0x7fffff)) *
          0x100) / uVar18;
  (pEVar4->info).iblk4_prop = uVar7;
  (pEVar4->info).sse = (ulong)*(uint6 *)(lVar14 + 0x1696);
  (pEVar4->info).lvl16_inter_num = *(uint *)(lVar14 + 0x1798) & 0x1fffff;
  (pEVar4->info).lvl8_inter_num = *(uint *)(lVar14 + 0x179c) & 0x7fffff;
  (pEVar4->info).lvl16_intra_num = *(uint *)(lVar14 + 0x17a4) & 0x1fffff;
  (pEVar4->info).lvl8_intra_num = *(uint *)(lVar14 + 0x17a8) & 0x7fffff;
  (pEVar4->info).lvl4_intra_num = *(uint *)(lVar14 + 0x17ac) & 0x7fffff;
  *(int *)((long)hal + 0xb0) = iVar12;
  *(uint *)((long)hal + 0xb4) = uVar6;
  *(uint *)((long)hal + 0xc0) = uVar7;
  (task->hal_ret).data = (void *)((long)hal + 0x90);
  (task->hal_ret).number = 1;
  lVar14 = *(long *)((long)hal + 0x1d0);
  uVar6 = ((uint)(*(int *)(lVar14 + 0x17c8) * 0x11 + *(int *)(lVar14 + 0x17cc) * 0x16 +
                 *(int *)(lVar14 + 0x17d0) * 0x18) >> 2) * 100;
  RVar10 = 100;
  if (uVar6 <= uVar18 * 5) {
    RVar10 = 0;
  }
  RVar8 = 200;
  if (uVar6 <= uVar18 * 0xf) {
    RVar8 = RVar10;
  }
  uVar7 = (((uint)(*(int *)(lVar14 + 0x17dc) * 5 + *(int *)(lVar14 + 0x17e0) * 6) >> 2) +
          *(int *)(lVar14 + 0x17d8)) * 100;
  uVar6 = 2;
  if (uVar7 <= uVar18 * 0x1e) {
    uVar6 = (uint)(uVar18 * 0xd < uVar7);
  }
  (pEVar4->info).motion_level = RVar8;
  (pEVar4->info).complex_level = uVar6;
  if ((hal_h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","motion_level %u, complex_level %u\n",
               "hal_h264e_vepu580_ret_task",(ulong)(pEVar4->info).motion_level,
               (ulong)(pEVar4->info).complex_level);
  }
  plVar5 = *(long **)((long)hal + 0x168);
  if (plVar5 == (long *)0x0) goto LAB_002265b4;
  pEVar4 = task->rc_task;
  iVar13 = *(int *)(*(long *)*plVar5 + 0x1864);
  *(uint *)((long)plVar5 + 0xc) = (uint)(iVar13 != 1);
  lVar17 = ((long *)*plVar5)[0x34];
  lVar16 = (long)(task->flags).reg_idx * 0x1cb8;
  lVar14 = lVar17 + lVar16;
  iVar12 = *(int *)(lVar17 + 0x17c4 + lVar16);
  iVar1 = *(int *)(lVar17 + 0x17c8 + lVar16);
  iVar2 = *(int *)(lVar17 + 0x17cc + lVar16);
  iVar3 = *(int *)(lVar17 + 0x17d0 + lVar16);
  lVar17 = 0;
  do {
    *(RK_S32 *)((long)local_48 + lVar17) =
         madp_num_map[0][lVar17 + 3] * iVar3 + madp_num_map[0][lVar17 + 2] * iVar2 +
         madp_num_map[0][lVar17 + 1] * iVar1 + madp_num_map[0][lVar17] * iVar12;
    lVar17 = lVar17 + 4;
  } while (lVar17 != 0x14);
  uVar6 = 0;
  uVar18 = 0;
  uVar7 = *(uint *)(lVar14 + 0x17bc) & 0x7fffff;
  if (uVar7 != 0) {
    uVar18 = *(uint *)(lVar14 + 0x17b8) / uVar7;
  }
  *(uint *)((long)plVar5 + 100) = uVar18;
  (pEVar4->info).madi = uVar18;
  uVar18 = *(uint *)(lVar14 + 0x17b4) & 0x1fffff;
  if (uVar18 != 0) {
    uVar6 = *(uint *)(lVar14 + 0x17b0) / uVar18;
  }
  *(uint *)((long)plVar5 + 0x5c) = uVar6;
  (pEVar4->info).madp = uVar6;
  iVar12 = *(int *)(lVar14 + 0x17d8) + *(int *)(lVar14 + 0x17d4) + *(int *)(lVar14 + 0x17dc);
  iVar12 = iVar12 + *(int *)(lVar14 + 0x17e0) + (uint)(iVar12 + *(int *)(lVar14 + 0x17e0) == 0);
  if (local_48[4] == 0) {
    uVar18 = 3;
  }
  else {
    sVar9 = (iVar13 != 1) * '\x05' + 10;
    uVar6 = (uint)(iVar13 != 1);
    lVar14 = 0;
    do {
      if (*(int *)((long)mb_avg_madp_thd + (ulong)(uVar6 * 0xc) + lVar14) <=
          *(int *)((long)plVar5 + 0x5c)) {
        uVar18 = 2;
        if ((((local_48[0] <=
               *(int *)((long)ctu_madp_cnt_thd[0] + lVar14 * 8 + (ulong)(uVar6 * 0x60)) * iVar12 >>
               sVar9) &&
             (local_48[1] <=
              *(int *)((ulong)(uVar6 * 0x60) + 0x2fd7d4 + lVar14 * 8) * iVar12 >> sVar9)) &&
            (local_48[2] <=
             *(int *)((ulong)(uVar6 * 0x60) + 0x2fd7d8 + lVar14 * 8) * iVar12 >> sVar9)) &&
           ((((local_48[0] <=
               *(int *)((ulong)(uVar6 * 0x60) + 0x2fd7dc + lVar14 * 8) * iVar12 >> sVar9 &&
              (local_48[1] <=
               *(int *)((ulong)(uVar6 * 0x60) + 0x2fd7e0 + lVar14 * 8) * iVar12 >> sVar9)) ||
             (*(int *)((ulong)(uVar6 * 0x60) + 0x2fd7e4 + lVar14 * 8) * iVar12 >> sVar9 <=
              local_48[3])) &&
            (*(int *)((ulong)(uVar6 * 0x60) + 0x2fd7e8 + lVar14 * 8) * iVar12 >> sVar9 <=
             local_48[3])))) {
          uVar18 = (uint)(local_48[3] <
                         iVar12 * *(int *)((ulong)(uVar6 * 0x60) + 0x2fd7ec + lVar14 * 8) >> sVar9);
        }
        goto LAB_002264e0;
      }
      lVar14 = lVar14 + 4;
    } while ((int)lVar14 != 0xc);
    uVar18 = 0;
  }
LAB_002264e0:
  if (uVar18 == 3) {
    iVar13 = (int)plVar5[2] * 0xb + *(int *)((long)plVar5 + 0x14) * 8;
    iVar12 = 0x1c;
  }
  else {
    iVar13 = (int)plVar5[2] * 0xb + uVar18 * 0xd + *(int *)((long)plVar5 + 0x14) * 8;
    iVar12 = 0x29;
  }
  lVar14 = 0;
  do {
    iVar13 = iVar13 + *(int *)((long)plVar5 + lVar14 * 4 + 0x18) * 6;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  *(undefined4 *)(plVar5 + 1) = 0;
  uVar6 = (uint)(iVar12 <= iVar13);
  if ((*(int *)((long)plVar5 + 0x4c) == 0) || ((int)plVar5[10] == 0)) {
    if (((int)plVar5[10] != 0) &&
       ((*(int *)((long)plVar5 + 0x54) != 0 && (uVar7 = uVar6, (int)plVar5[0xb] != 0))))
    goto LAB_00226574;
  }
  else {
    uVar7 = 1;
    if (*(int *)((long)plVar5 + 0x54) == 0) {
      uVar7 = uVar6;
    }
LAB_00226574:
    *(uint *)(plVar5 + 1) = uVar7;
  }
  if (uVar18 != 3) {
    *(long *)((long)plVar5 + 0x14) = plVar5[2];
    *(long *)((long)plVar5 + 0x1c) = plVar5[3];
    *(uint *)(plVar5 + 2) = uVar18;
  }
  *(undefined4 *)(plVar5 + 0xb) = *(undefined4 *)((long)plVar5 + 0x54);
  plVar5[10] = *(long *)((long)plVar5 + 0x4c);
  *(uint *)((long)plVar5 + 0x4c) = uVar6;
  *(long *)((long)plVar5 + 0x3c) = plVar5[7];
  *(long *)((long)plVar5 + 0x44) = plVar5[8];
  *(int *)(plVar5 + 7) = (int)plVar5[1];
  *(undefined4 *)(plVar5 + 0xd) = *(undefined4 *)((long)plVar5 + 100);
  *(undefined4 *)(plVar5 + 0xc) = *(undefined4 *)((long)plVar5 + 0x5c);
LAB_002265b4:
  mpp_dev_multi_offset_reset(*(MppDevRegOffCfgs **)((long)hal + 0x38));
  if (*(H264eDpb **)((long)hal + 0x70) != (H264eDpb *)0x0) {
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).curr_idx);
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).refr_idx);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu580_ret_task(void * hal, HalEncTask * task)
{
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = &ctx->regs_sets[task->flags.reg_idx];
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;

    hal_h264e_dbg_func("enter %p\n", hal);

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = regs->reg_st.qp_sum / mbs;
    rc_info->madi = (!regs->reg_st.st_bnum_b16.num_b16) ? 0 :
                    regs->reg_st.madi /  regs->reg_st.st_bnum_b16.num_b16;
    rc_info->madp = (!regs->reg_st.st_bnum_cme.num_ctu) ? 0 :
                    regs->reg_st.madp / regs->reg_st.st_bnum_cme.num_ctu;
    rc_info->iblk4_prop = (regs->reg_st.st_pnum_i4.pnum_i4 +
                           regs->reg_st.st_pnum_i8.pnum_i8 +
                           regs->reg_st.st_pnum_i16.pnum_i16) * 256 / mbs;

    rc_info->sse = ((RK_S64)regs->reg_st.sse_h32 << 16) + (regs->reg_st.st_sse_bsl.sse_l16 & 0xffff);
    rc_info->lvl16_inter_num = regs->reg_st.st_pnum_p16.pnum_p16;
    rc_info->lvl8_inter_num  = regs->reg_st.st_pnum_p8.pnum_p8;
    rc_info->lvl16_intra_num = regs->reg_st.st_pnum_i16.pnum_i16;
    rc_info->lvl8_intra_num  = regs->reg_st.st_pnum_i8.pnum_i8;
    rc_info->lvl4_intra_num  = regs->reg_st.st_pnum_i4.pnum_i4;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    //RK_U32 madi_th_cnt0 = ctx->regs_set->reg_st.madi_b16num0;
    RK_U32 madi_th_cnt1 = ctx->regs_set->reg_st.madi_b16num1;
    RK_U32 madi_th_cnt2 = ctx->regs_set->reg_st.madi_b16num2;
    RK_U32 madi_th_cnt3 = ctx->regs_set->reg_st.madi_b16num3;
    //RK_U32 madp_th_cnt0 = ctx->regs_set->reg_st.md_sad_b16num0;
    RK_U32 madp_th_cnt1 = ctx->regs_set->reg_st.md_sad_b16num1;
    RK_U32 madp_th_cnt2 = ctx->regs_set->reg_st.md_sad_b16num2;
    RK_U32 madp_th_cnt3 = ctx->regs_set->reg_st.md_sad_b16num3;

    RK_U32 md_cnt = (24 * madp_th_cnt3 + 22 * madp_th_cnt2 + 17 * madp_th_cnt1) >> 2;
    RK_U32 madi_cnt = (6 * madi_th_cnt3 + 5 * madi_th_cnt2 + 4 * madi_th_cnt1) >> 2;

    rc_info->motion_level = 0;
    if (md_cnt * 100 > 15 * mbs)
        rc_info->motion_level = 200;
    else if (md_cnt * 100 > 5 * mbs)
        rc_info->motion_level = 100;
    else
        rc_info->motion_level = 0;

    rc_info->complex_level = 0;
    if (madi_cnt * 100 > 30 * mbs)
        rc_info->complex_level = 2;
    else if (madi_cnt * 100 > 13 * mbs)
        rc_info->complex_level = 1;
    else
        rc_info->complex_level = 0;

    hal_h264e_dbg_rc("motion_level %u, complex_level %u\n", rc_info->motion_level, rc_info->complex_level);

    vepu580_h264e_tune_stat_update(ctx->tune, task);

    mpp_dev_multi_offset_reset(ctx->offsets);

    if (ctx->dpb) {
        h264e_dpb_hal_end(ctx->dpb, task->flags.curr_idx);
        h264e_dpb_hal_end(ctx->dpb, task->flags.refr_idx);
    }

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}